

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

ptr<rpc_listener> __thiscall
nuraft::asio_service::create_rpc_listener(asio_service *this,ushort listening_port,ptr<logger> *l)

{
  io_context *__args_1;
  shared_ptr<nuraft::logger> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_00000032;
  ptr<rpc_listener> pVar1;
  undefined1 local_3b;
  ushort listening_port_local;
  delayed_task_scheduler local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [3];
  
  listening_port_local = (ushort)l;
  __args_1 = *(io_context **)(CONCAT62(in_register_00000032,listening_port) + 0x10);
  local_38._vptr_delayed_task_scheduler = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::asio_rpc_listener,std::allocator<nuraft::asio_rpc_listener>,nuraft::asio_service_impl*&,asio::io_context&,asio::ssl::context&,unsigned_short&,bool&,std::shared_ptr<nuraft::logger>&>
            (a_Stack_30,(asio_rpc_listener **)&local_38,
             (allocator<nuraft::asio_rpc_listener> *)&local_3b,
             (asio_service_impl **)(CONCAT62(in_register_00000032,listening_port) + 0x10),__args_1,
             (context *)(__args_1 + 1),&listening_port_local,(bool *)(__args_1 + 0x1b),in_RCX);
  std::__shared_ptr<nuraft::asio_rpc_listener,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nuraft::asio_rpc_listener,nuraft::asio_rpc_listener>
            ((__shared_ptr<nuraft::asio_rpc_listener,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (asio_rpc_listener *)local_38._vptr_delayed_task_scheduler);
  (this->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)0x0;
  (this->super_delayed_task_scheduler)._vptr_delayed_task_scheduler =
       local_38._vptr_delayed_task_scheduler;
  (this->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)a_Stack_30[0]._M_pi;
  pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<rpc_listener>)
         pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<rpc_listener> asio_service::create_rpc_listener( ushort listening_port,
                                                     ptr<logger>& l )
{
    try {
        return cs_new< asio_rpc_listener >
                     ( impl_,
                       impl_->io_svc_,
                       impl_->ssl_server_ctx_,
                       listening_port,
                       impl_->my_opt_.enable_ssl_,
                       l );
    } catch (std::exception& ee) {
        // Most likely exception happens due to wrong endpoint.
        p_er("got exception: %s", ee.what());
        return nullptr;
    }
}